

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceDescriptorProto::MergeFrom
          (ServiceDescriptorProto *this,ServiceDescriptorProto *from)

{
  bool bVar1;
  LogMessage *other;
  string *value;
  ServiceOptions *this_00;
  ServiceOptions *from_00;
  UnknownFieldSet *this_01;
  UnknownFieldSet *other_00;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  ServiceDescriptorProto *local_18;
  ServiceDescriptorProto *from_local;
  ServiceDescriptorProto *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0xf3e);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  RepeatedPtrField<google::protobuf::MethodDescriptorProto>::MergeFrom
            (&this->method_,&local_18->method_);
  if ((local_18->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(local_18);
    if (bVar1) {
      value = name_abi_cxx11_(local_18);
      set_name(this,value);
    }
    bVar1 = has_options(local_18);
    if (bVar1) {
      this_00 = mutable_options(this);
      from_00 = options(local_18);
      ServiceOptions::MergeFrom(this_00,from_00);
    }
  }
  this_01 = mutable_unknown_fields(this);
  other_00 = unknown_fields(local_18);
  UnknownFieldSet::MergeFrom(this_01,other_00);
  return;
}

Assistant:

void ServiceDescriptorProto::MergeFrom(const ServiceDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  method_.MergeFrom(from.method_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_options()) {
      mutable_options()->::google::protobuf::ServiceOptions::MergeFrom(from.options());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}